

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O0

void __thiscall
ObjectTest_basic_assignment_operator_Test::ObjectTest_basic_assignment_operator_Test
          (ObjectTest_basic_assignment_operator_Test *this)

{
  ObjectTest_basic_assignment_operator_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  *(undefined ***)this = &PTR__ObjectTest_basic_assignment_operator_Test_0080fdd0;
  return;
}

Assistant:

TEST(ObjectTest, basic_assignment_operator) {
	object obj;

	OBJECT_BASIC_ASSIGNMENT_OPERATOR_TEST(obj, bool);
	OBJECT_BASIC_ASSIGNMENT_OPERATOR_TEST(obj, signed_char_t);
	OBJECT_BASIC_ASSIGNMENT_OPERATOR_TEST(obj, unsigned_char_t);
	OBJECT_BASIC_ASSIGNMENT_OPERATOR_TEST(obj, short);
	OBJECT_BASIC_ASSIGNMENT_OPERATOR_TEST(obj, int);
	OBJECT_BASIC_ASSIGNMENT_OPERATOR_TEST(obj, long);
	OBJECT_BASIC_ASSIGNMENT_OPERATOR_TEST(obj, long_long_t);
	OBJECT_BASIC_ASSIGNMENT_OPERATOR_TEST(obj, intmax_t);
	OBJECT_BASIC_ASSIGNMENT_OPERATOR_TEST(obj, float);
	OBJECT_BASIC_ASSIGNMENT_OPERATOR_TEST(obj, double);
	OBJECT_BASIC_ASSIGNMENT_OPERATOR_TEST(obj, long_double_t);
	OBJECT_BASIC_ASSIGNMENT_OPERATOR_TEST(obj, std::u8string);
	OBJECT_BASIC_ASSIGNMENT_OPERATOR_TEST(obj, object::array_type);

	// const char*
	obj = u8"";
	EXPECT_TRUE(obj.has<std::u8string>());
	EXPECT_EQ(obj.get<std::u8string>(), std::u8string{});

	// std::u8string_view
	obj = u8""sv;
	EXPECT_TRUE(obj.has<std::u8string>());
	EXPECT_EQ(obj.get<std::u8string>(), std::u8string{});
}